

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void mxx::
     global_exscan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (int *begin,int *end,int *out,comm *param_4)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  T sum;
  comm nonzero_comm;
  int local_44;
  comm local_40;
  
  comm::split(&local_40,param_4,(uint)((long)end - (long)begin != 0));
  if (end != begin) {
    uVar5 = (long)end - (long)begin >> 2;
    local_44 = begin[uVar5 - 1];
    iVar2 = *begin;
    *out = 0;
    begin = begin + 1;
    if (begin != end) {
      piVar3 = out + 1;
      do {
        iVar1 = *begin;
        *piVar3 = iVar2;
        begin = begin + 1;
        piVar3 = piVar3 + 1;
        iVar2 = iVar1 + iVar2;
      } while (begin != end);
    }
    local_44 = local_44 + out[uVar5 - 1];
    iVar2 = exscan<int,std::plus<int>>(&local_44,&local_40,1);
    *out = iVar2;
    if (1 < uVar5) {
      uVar4 = 1;
      do {
        out[uVar4] = out[uVar4] + iVar2;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  comm::~comm(&local_40);
  return;
}

Assistant:

void global_exscan(InIterator begin, InIterator end, OutIterator out, Func func, const mxx::comm& comm = mxx::comm()) {
    OutIterator o = out;
    size_t n = std::distance(begin, end);
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        typedef typename std::iterator_traits<OutIterator>::value_type T;
        T sum = *(begin+(n-1));
        // local scan
        local_exscan(begin, end, out, func);
        // mxx::scan
        sum += *(o + (n-1));
        T presum = exscan(sum, func, nonzero_comm);
        *o++ = presum;
        // accumulate previous sum on all local elements
        for (size_t i = 1; i < n; ++i) {
            *o = func(presum, *o);
            ++o;
        }
    }
}